

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_NewFrame(void)

{
  uchar uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  ImGuiMouseCursor IVar6;
  ImGuiIO *pIVar7;
  ImGuiIO *pIVar8;
  float *pfVar9;
  uchar *puVar10;
  GLFWcursor *cursorHandle;
  int i;
  long lVar11;
  bool bVar12;
  float fVar13;
  ImVec2 IVar15;
  float fVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double mouse_x;
  int buttons_count;
  int display_h;
  int display_w;
  int h;
  int w;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  pIVar7 = ImGui::GetIO();
  glfwGetWindowSize(g_Window,(int *)&local_2c,&local_30);
  glfwGetFramebufferSize(g_Window,&local_34,&local_38);
  IVar2.y = (float)local_30;
  IVar2.x = (float)(int)local_2c;
  pIVar7->DisplaySize = IVar2;
  auVar16._4_4_ = 0;
  auVar16._0_4_ = local_2c;
  auVar16._8_4_ = local_30;
  auVar16._12_4_ = 0;
  auVar17._0_4_ = (float)local_34;
  auVar17._4_4_ = (float)local_38;
  auVar17._8_8_ = 0;
  auVar18._4_4_ = (float)(SUB168(auVar16 | _DAT_00190b80,8) - DAT_00190b80._8_8_);
  auVar18._0_4_ = (float)(SUB168(auVar16 | _DAT_00190b80,0) - (double)DAT_00190b80);
  auVar18._8_8_ = 0;
  auVar18 = divps(auVar17,auVar18);
  IVar15.x = (float)(auVar18._0_4_ & -(uint)(0 < (int)local_2c));
  IVar15.y = (float)(auVar18._4_4_ & -(uint)(0 < local_30));
  pIVar7->DisplayFramebufferScale = IVar15;
  dVar4 = glfwGetTime();
  if (0.0 < g_Time) {
    fVar14 = (float)(dVar4 - g_Time);
  }
  else {
    fVar14 = 0.016666668;
  }
  pIVar7->DeltaTime = fVar14;
  g_Time = dVar4;
  pIVar8 = ImGui::GetIO();
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    bVar12 = true;
    if (g_MouseJustPressed[lVar11] == false) {
      iVar5 = glfwGetMouseButton(g_Window,(int)lVar11);
      bVar12 = iVar5 != 0;
    }
    pIVar8->MouseDown[lVar11] = bVar12;
    g_MouseJustPressed[lVar11] = false;
  }
  fVar14 = (pIVar8->MousePos).x;
  fVar13 = (pIVar8->MousePos).y;
  (pIVar8->MousePos).x = -3.4028235e+38;
  (pIVar8->MousePos).y = -3.4028235e+38;
  iVar5 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar5 != 0) {
    if (pIVar8->WantSetMousePos == true) {
      glfwSetCursorPos(g_Window,(double)fVar14,(double)fVar13);
    }
    else {
      glfwGetCursorPos(g_Window,(double *)&local_48,(double *)&local_40);
      IVar3.y = (float)(double)CONCAT44(local_40._4_4_,(uint)local_40);
      IVar3.x = (float)(double)CONCAT44(local_48._4_4_,(int)local_48);
      pIVar8->MousePos = IVar3;
    }
  }
  pIVar8 = ImGui::GetIO();
  if (((pIVar8->ConfigFlags & 0x20) == 0) &&
     (iVar5 = glfwGetInputMode(g_Window,0x33001), iVar5 != 0x34003)) {
    IVar6 = ImGui::GetMouseCursor();
    iVar5 = 0x34002;
    if ((IVar6 != -1) && (pIVar8->MouseDrawCursor == false)) {
      cursorHandle = g_MouseCursors[IVar6];
      if (g_MouseCursors[IVar6] == (GLFWcursor *)0x0) {
        cursorHandle = g_MouseCursors[0];
      }
      glfwSetCursor(g_Window,cursorHandle);
      iVar5 = 0x34001;
    }
    glfwSetInputMode(g_Window,0x33001,iVar5);
  }
  pIVar7->NavInputs[0x10] = 0.0;
  pIVar7->NavInputs[0x11] = 0.0;
  pIVar7->NavInputs[0x12] = 0.0;
  pIVar7->NavInputs[0x13] = 0.0;
  pIVar7->NavInputs[0xc] = 0.0;
  pIVar7->NavInputs[0xd] = 0.0;
  pIVar7->NavInputs[0xe] = 0.0;
  pIVar7->NavInputs[0xf] = 0.0;
  pIVar7->NavInputs[8] = 0.0;
  pIVar7->NavInputs[9] = 0.0;
  pIVar7->NavInputs[10] = 0.0;
  pIVar7->NavInputs[0xb] = 0.0;
  pIVar7->NavInputs[0x14] = 0.0;
  pIVar7->NavInputs[4] = 0.0;
  pIVar7->NavInputs[5] = 0.0;
  pIVar7->NavInputs[6] = 0.0;
  pIVar7->NavInputs[7] = 0.0;
  pIVar7->NavInputs[0] = 0.0;
  pIVar7->NavInputs[1] = 0.0;
  pIVar7->NavInputs[2] = 0.0;
  pIVar7->NavInputs[3] = 0.0;
  if ((pIVar7->ConfigFlags & 2) == 0) {
    return;
  }
  local_48._0_4_ = 0;
  local_40._0_4_ = 0;
  pfVar9 = glfwGetJoystickAxes(0,(int *)&local_48);
  puVar10 = glfwGetJoystickButtons(0,(int *)&local_40);
  if ((int)(uint)local_40 < 1) goto LAB_0015063f;
  if (*puVar10 == '\x01') {
    pIVar7->NavInputs[0] = 1.0;
  }
  if ((uint)local_40 == 1) goto LAB_0015063f;
  if (puVar10[1] == '\x01') {
    pIVar7->NavInputs[1] = 1.0;
  }
  if ((uint)local_40 < 3) goto LAB_0015063f;
  if (puVar10[2] == '\x01') {
    pIVar7->NavInputs[3] = 1.0;
  }
  if ((uint)local_40 == 3) goto LAB_0015063f;
  if (puVar10[3] == '\x01') {
    pIVar7->NavInputs[2] = 1.0;
  }
  if ((uint)local_40 < 0xe) {
    if (0xb < (uint)local_40) goto LAB_0015059c;
    if ((uint)local_40 == 0xb) goto LAB_001505b3;
    if ((uint)local_40 < 5) goto LAB_0015063f;
  }
  else {
    if (puVar10[0xd] == '\x01') {
      pIVar7->NavInputs[4] = 1.0;
    }
LAB_0015059c:
    if (puVar10[0xb] == '\x01') {
      pIVar7->NavInputs[5] = 1.0;
    }
LAB_001505b3:
    if (puVar10[10] == '\x01') {
      pIVar7->NavInputs[6] = 1.0;
    }
    if ((0xc < (uint)local_40) && (puVar10[0xc] == '\x01')) {
      pIVar7->NavInputs[7] = 1.0;
    }
  }
  if (puVar10[4] == '\x01') {
    pIVar7->NavInputs[0xc] = 1.0;
  }
  if ((uint)local_40 < 6) {
    lVar11 = 0x37c;
    uVar1 = puVar10[4];
  }
  else {
    if (puVar10[5] == '\x01') {
      pIVar7->NavInputs[0xd] = 1.0;
    }
    if (puVar10[4] == '\x01') {
      pIVar7->NavInputs[0xe] = 1.0;
    }
    if ((uint)local_40 < 6) goto LAB_0015063f;
    lVar11 = 0x380;
    uVar1 = puVar10[5];
  }
  if (uVar1 == '\x01') {
    *(undefined4 *)((long)pIVar7->KeyMap + lVar11 + -0x34) = 0x3f800000;
  }
LAB_0015063f:
  if ((int)local_48 < 1) {
    fVar14 = 0.0;
  }
  else {
    fVar14 = *pfVar9 + 0.3;
  }
  fVar13 = 1.0;
  if (fVar14 / -0.59999996 <= 1.0) {
    fVar13 = fVar14 / -0.59999996;
  }
  if (pIVar7->NavInputs[8] <= fVar13 && fVar13 != pIVar7->NavInputs[8]) {
    pIVar7->NavInputs[8] = fVar13;
  }
  if ((int)local_48 < 1) {
    fVar14 = 0.0;
  }
  else {
    fVar14 = *pfVar9 + -0.3;
  }
  fVar13 = 1.0;
  if (fVar14 / 0.59999996 <= 1.0) {
    fVar13 = fVar14 / 0.59999996;
  }
  if (pIVar7->NavInputs[9] <= fVar13 && fVar13 != pIVar7->NavInputs[9]) {
    pIVar7->NavInputs[9] = fVar13;
  }
  fVar14 = 0.0;
  if (1 < (int)local_48) {
    fVar14 = pfVar9[1] + -0.3;
  }
  fVar13 = 1.0;
  if (fVar14 / 0.59999996 <= 1.0) {
    fVar13 = fVar14 / 0.59999996;
  }
  if (pIVar7->NavInputs[10] <= fVar13 && fVar13 != pIVar7->NavInputs[10]) {
    pIVar7->NavInputs[10] = fVar13;
  }
  fVar14 = 0.0;
  if (1 < (int)local_48) {
    fVar14 = pfVar9[1] + 0.3;
  }
  fVar13 = 1.0;
  if (fVar14 / -0.59999996 <= 1.0) {
    fVar13 = fVar14 / -0.59999996;
  }
  if (pIVar7->NavInputs[0xb] <= fVar13 && fVar13 != pIVar7->NavInputs[0xb]) {
    pIVar7->NavInputs[0xb] = fVar13;
  }
  pIVar7->BackendFlags =
       (uint)(0 < (int)(uint)local_40 && 0 < (int)local_48) | pIVar7->BackendFlags & 0xfffffffeU;
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Gamepad navigation mapping
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0)
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
        else
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }
}